

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O1

int __thiscall
vkt::sr::anon_unknown_0::ShaderIndexingTests::init(ShaderIndexingTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  TestContext *pTVar2;
  int iVar3;
  int iVar4;
  DataType dataType;
  int extraout_EAX;
  TestNode *pTVar5;
  char *pcVar6;
  long *plVar7;
  TestNode *pTVar8;
  ostream *poVar9;
  size_t sVar10;
  char *pcVar11;
  long *plVar12;
  size_type *psVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ostringstream *poVar17;
  long lVar18;
  ShaderEvalFunc p_Var19;
  long lVar20;
  ulong uVar21;
  StringTemplate vertTemplate;
  _Alloc_hider local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  StringTemplate fragTemplate;
  string vertexShaderSource;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  allocator<char> local_412;
  allocator<char> local_411;
  TestNode *local_410;
  string desc;
  string name;
  string local_3a8;
  ulong local_388;
  char *local_380;
  ulong local_378;
  ostringstream frag;
  long local_360;
  long lStack_358;
  ios_base local_300 [264];
  string local_1f8;
  string local_1d8;
  ostringstream vtx;
  long local_1a8;
  long lStack_1a0;
  ios_base local_148 [264];
  long local_40;
  long local_38;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "varying_array","Varying array access tests.");
  lVar15 = 0;
  do {
    DVar1 = sr::(anonymous_namespace)::ShaderOperatorTests::init()::s_floatTypes[lVar15];
    lVar14 = 0;
    do {
      local_410 = (TestNode *)0x23;
      if (lVar14 == 2) {
        local_410 = (TestNode *)0x1d;
      }
      pcVar11 = "\tfor (int i = 0; i < ui_four; i++)\n";
      if (lVar14 == 2) {
        pcVar11 = "\tfor (int i = 0; i < 4; i++)\n";
      }
      lVar16 = 0;
      do {
        pcVar6 = glu::getDataTypeName(DVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fragTemplate,pcVar6,(allocator<char> *)&vertexShaderSource);
        plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
        params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
        }
        else {
          params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
          params._M_t._M_impl._0_8_ = (long *)*plVar7;
        }
        params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&params);
        vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template.field_2._8_8_ = plVar7[3];
        }
        else {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
        }
        vertTemplate.m_template._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
        _frag = &local_360;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_360 = *plVar12;
          lStack_358 = plVar7[3];
        }
        else {
          local_360 = *plVar12;
          _frag = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
        _vtx = &local_1a8;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_1a8 = *plVar12;
          lStack_1a0 = plVar7[3];
        }
        else {
          local_1a8 = *plVar12;
          _vtx = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          name.field_2._M_allocated_capacity = *psVar13;
          name.field_2._8_8_ = plVar7[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar13;
          name._M_dataplus._M_p = (pointer)*plVar7;
        }
        name._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (_vtx != &local_1a8) {
          operator_delete(_vtx,local_1a8 + 1);
        }
        if (_frag != &local_360) {
          operator_delete(_frag,local_360 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
            &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)params._M_t._M_impl._0_8_,
                          (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
          operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                          fragTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__cxx11::string::_M_construct<char_const*>((string *)&params,"Varying array with ","");
        plVar7 = (long *)std::__cxx11::string::append((char *)&params);
        vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template.field_2._8_8_ = plVar7[3];
        }
        else {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
        }
        vertTemplate.m_template._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
        _frag = &local_360;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_360 = *plVar12;
          lStack_358 = plVar7[3];
        }
        else {
          local_360 = *plVar12;
          _frag = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
        _vtx = &local_1a8;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_1a8 = *plVar12;
          lStack_1a0 = plVar7[3];
        }
        else {
          local_1a8 = *plVar12;
          _vtx = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
        desc._M_dataplus._M_p = (pointer)&desc.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          desc.field_2._M_allocated_capacity = *psVar13;
          desc.field_2._8_8_ = plVar7[3];
        }
        else {
          desc.field_2._M_allocated_capacity = *psVar13;
          desc._M_dataplus._M_p = (pointer)*plVar7;
        }
        desc._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (_vtx != &local_1a8) {
          operator_delete(_vtx,local_1a8 + 1);
        }
        if (_frag != &local_360) {
          operator_delete(_frag,local_360 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
            &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)params._M_t._M_impl._0_8_,
                          (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"#version 310 es\n",0x10)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n",0x2d);
        if (lVar14 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,
                     "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n",
                     0x49);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,
                     "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n",
                     0x48);
          lVar18 = 0x4a;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,
                     "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n",
                     0x48);
          pcVar6 = "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n";
LAB_005856ec:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,pcVar6,lVar18);
        }
        else {
          lVar18 = 0x48;
          pcVar6 = "layout(std140, binding = 4) uniform something { mediump int ui_four; };\n";
          if (lVar14 == 3) goto LAB_005856ec;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,
                   "layout(location = 0) out ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n",0x45);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"void main()\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
        if (lVar14 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[0] = ${VAR_TYPE}(a_coords);\n",0x21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[1] = ${VAR_TYPE}(a_coords) * 0.5;\n",0x27);
          lVar18 = 0x29;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[2] = ${VAR_TYPE}(a_coords) * 0.25;\n",0x28);
          pcVar6 = "\tvar[3] = ${VAR_TYPE}(a_coords) * 0.125;\n";
        }
        else if (lVar14 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[ui_zero]  = ${VAR_TYPE}(a_coords);\n",0x28);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[ui_one]   = ${VAR_TYPE}(a_coords) * 0.5;\n",0x2e);
          lVar18 = 0x30;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tvar[ui_two]   = ${VAR_TYPE}(a_coords) * 0.25;\n",0x2f);
          pcVar6 = "\tvar[ui_three] = ${VAR_TYPE}(a_coords) * 0.125;\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n",
                     0x3a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,pcVar11,(long)local_410);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\t{\n",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\t\tvar[i] = ${VAR_TYPE}(coords);\n",0x20);
          lVar18 = 3;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\t\tcoords = coords * 0.5;\n",0x19);
          pcVar6 = "\t}\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,pcVar6,lVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"#version 310 es\n",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"precision mediump int;\n",0x17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
        if (lVar16 == 8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,
                     "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n",
                     0x49);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,
                     "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n",
                     0x48);
          lVar18 = 0x4a;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,
                     "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n",
                     0x48);
          pcVar6 = "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n";
LAB_0058596f:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar18);
        }
        else {
          lVar18 = 0x49;
          pcVar6 = "layout(std140, binding = 4) uniform something4 { mediump int ui_four; };\n";
          if (lVar16 == 0x18) goto LAB_0058596f;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,
                   "layout(location = 0) in ${PRECISION} ${VAR_TYPE} var[${ARRAY_LEN}];\n",0x44);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"void main()\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",0x32);
        if (lVar16 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[0];\n",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[1];\n",0x10);
          lVar18 = 0x10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[2];\n",0x10);
          pcVar6 = "\tres += var[3];\n";
        }
        else if (lVar16 == 8) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[ui_zero];\n",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[ui_one];\n",0x15);
          lVar18 = 0x17;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&frag,"\tres += var[ui_two];\n",0x15);
          pcVar6 = "\tres += var[ui_three];\n";
        }
        else {
          pcVar6 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (lVar16 == 0x10) {
            pcVar6 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          lVar20 = 0x23;
          if (lVar16 == 0x10) {
            lVar20 = 0x1d;
          }
          lVar18 = 0x11;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar20);
          pcVar6 = "\t\tres += var[i];\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"\to_color = vec4(res${PADDING});\n",0x20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
        params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &params._M_t._M_impl.super__Rb_tree_header._M_header;
        params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_const_char_*,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [9])0xb1bc86,(char **)&fragTemplate);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_p != &local_4c0) {
          operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0xb20d95);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_p != &local_4c0) {
          operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])0xb1bc97,(char (*) [8])0xb5805a);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_p != &local_4c0) {
          operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if (DVar1 == TYPE_FLOAT_VEC3) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0xb25384);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar1 == TYPE_FLOAT_VEC2) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0xb2537f);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar1 == TYPE_FLOAT) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])0xb253d0);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])0xac6ac7);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_p != &local_4c0) {
          operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
          operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                          fragTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
        tcu::StringTemplate::specialize(&local_3a8,&fragTemplate,&params);
        if (DVar1 - TYPE_FLOAT < 4) {
          p_Var19 = (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_00d25980)[DVar1 - TYPE_FLOAT];
        }
        else {
          p_Var19 = (ShaderEvalFunc)0x0;
        }
        pTVar8 = (TestNode *)operator_new(0xe0);
        ShaderIndexingCase::ShaderIndexingCase
                  ((ShaderIndexingCase *)pTVar8,pTVar2,&name,&desc,true,p_Var19,&vertexShaderSource,
                   &local_3a8,DVar1,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        tcu::StringTemplate::~StringTemplate(&fragTemplate);
        tcu::StringTemplate::~StringTemplate(&vertTemplate);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&params._M_t);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
        std::ios_base::~ios_base(local_300);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
        std::ios_base::~ios_base(local_148);
        tcu::TestNode::addChild(pTVar5,pTVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)desc._M_dataplus._M_p != &desc.field_2) {
          operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        lVar16 = lVar16 + 8;
      } while (lVar16 != 0x20);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 4);
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  local_410 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_410,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "uniform_array","Uniform array access tests.");
  lVar15 = 0;
  do {
    DVar1 = sr::(anonymous_namespace)::ShaderOperatorTests::init()::s_floatTypes[lVar15];
    lVar14 = 0;
    local_388 = lVar15;
    do {
      pcVar11 = "\tfor (int i = 0; i < ui_four; i++)\n";
      if (lVar14 == 2) {
        pcVar11 = "\tfor (int i = 0; i < 4; i++)\n";
      }
      lVar15 = 0x23;
      if (lVar14 == 2) {
        lVar15 = 0x1d;
      }
      lVar16 = 0;
      do {
        glu::getShaderTypeName
                  (*(ShaderType *)
                    ((long)tessellation::createCommonEdgeTests(tcu::TestContext&)::primitiveTypes +
                    lVar16));
        pcVar6 = glu::getDataTypeName(DVar1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&params,pcVar6,(allocator<char> *)&fragTemplate.m_template);
        plVar7 = (long *)std::__cxx11::string::append((char *)&params);
        vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template.field_2._8_8_ = plVar7[3];
        }
        else {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
        }
        vertTemplate.m_template._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
        _frag = &local_360;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_360 = *plVar12;
          lStack_358 = plVar7[3];
        }
        else {
          local_360 = *plVar12;
          _frag = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
        _vtx = &local_1a8;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_1a8 = *plVar12;
          lStack_1a0 = plVar7[3];
        }
        else {
          local_1a8 = *plVar12;
          _vtx = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          name.field_2._M_allocated_capacity = *psVar13;
          name.field_2._8_8_ = plVar7[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar13;
          name._M_dataplus._M_p = (pointer)*plVar7;
        }
        name._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (_vtx != &local_1a8) {
          operator_delete(_vtx,local_1a8 + 1);
        }
        if (_frag != &local_360) {
          operator_delete(_frag,local_360 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
            &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)params._M_t._M_impl._0_8_,
                          (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        params._M_t._M_impl._0_8_ = &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::__cxx11::string::_M_construct<char_const*>((string *)&params,"Uniform array with ","");
        plVar7 = (long *)std::__cxx11::string::append((char *)&params);
        vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template.field_2._8_8_ = plVar7[3];
        }
        else {
          vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
          vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
        }
        vertTemplate.m_template._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
        _frag = &local_360;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_360 = *plVar12;
          lStack_358 = plVar7[3];
        }
        else {
          local_360 = *plVar12;
          _frag = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
        _vtx = &local_1a8;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_1a8 = *plVar12;
          lStack_1a0 = plVar7[3];
        }
        else {
          local_1a8 = *plVar12;
          _vtx = (long *)*plVar7;
        }
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
        desc._M_dataplus._M_p = (pointer)&desc.field_2;
        psVar13 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar13) {
          desc.field_2._M_allocated_capacity = *psVar13;
          desc.field_2._8_8_ = plVar7[3];
        }
        else {
          desc.field_2._M_allocated_capacity = *psVar13;
          desc._M_dataplus._M_p = (pointer)*plVar7;
        }
        desc._M_string_length = plVar7[1];
        *plVar7 = (long)psVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (_vtx != &local_1a8) {
          operator_delete(_vtx,local_1a8 + 1);
        }
        if (_frag != &local_360) {
          operator_delete(_frag,local_360 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
            &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)params._M_t._M_impl._0_8_,
                          (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
        poVar17 = (ostringstream *)&frag;
        if (lVar16 == 0) {
          poVar17 = (ostringstream *)&vtx;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"#version 310 es\n",0x10)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"#version 310 es\n",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n",0x2d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
        if (lVar16 == 0) {
          lVar18 = 0x2e;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_color;\n",0x2f);
          pcVar6 = "layout(location = 0) in mediump vec4 v_color;\n";
        }
        else {
          lVar18 = 0x2f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_coords;\n",0x30);
          pcVar6 = "layout(location = 0) in mediump vec4 v_coords;\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar18);
        if (lVar14 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar17,
                     "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n",
                     0x49);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar17,
                     "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n",
                     0x48);
          lVar18 = 0x4a;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar17,
                     "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n",
                     0x48);
          pcVar6 = "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n";
LAB_00586679:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,pcVar6,lVar18);
        }
        else {
          lVar18 = 0x49;
          pcVar6 = "layout(std140, binding = 4) uniform something4 { mediump int ui_four; };\n";
          if (lVar14 == 3) goto LAB_00586679;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar17,
                   "layout(std140, binding = 5) uniform something5 { ${PRECISION} ${VAR_TYPE} u_arr[${ARRAY_LEN}]; };\n"
                   ,0x62);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"void main()\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"void main()\n",0xc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar17,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",0x32);
        if (lVar14 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar17,"\tres += u_arr[0];\n",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar17,"\tres += u_arr[1];\n",0x12);
          lVar18 = 0x12;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar17,"\tres += u_arr[2];\n",0x12);
          pcVar6 = "\tres += u_arr[3];\n";
        }
        else if (lVar14 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar17,"\tres += u_arr[ui_zero];\n",0x18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar17,"\tres += u_arr[ui_one];\n",0x17);
          lVar18 = 0x19;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar17,"\tres += u_arr[ui_two];\n",0x17);
          pcVar6 = "\tres += u_arr[ui_three];\n";
        }
        else {
          lVar18 = 0x13;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,pcVar11,lVar15);
          pcVar6 = "\t\tres += u_arr[i];\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,pcVar6,lVar18);
        if (lVar16 == 0) {
          lVar18 = 0x14;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tv_color = vec4(res${PADDING});\n",0x20);
          pcVar6 = "\to_color = v_color;\n";
        }
        else {
          lVar18 = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
          pcVar6 = "\to_color = vec4(res${PADDING});\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
        params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &params._M_t._M_impl.super__Rb_tree_header._M_header;
        params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_const_char_*,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [9])0xb1bc86,(char **)&fragTemplate.m_template);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_p != &local_4c0) {
          operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0xb20d95);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_p != &local_4c0) {
          operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate,(char (*) [10])0xb1bc97,(char (*) [8])0xb5805a);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&params,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&vertTemplate);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_p != &local_4c0) {
          operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        if (DVar1 == TYPE_FLOAT_VEC3) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0xb25384);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar1 == TYPE_FLOAT_VEC2) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0xb2537f);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else if (DVar1 == TYPE_FLOAT) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])0xb253d0);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        else {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])0xac6ac7);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&params,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&vertTemplate);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_p != &local_4c0) {
          operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
          operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                          vertTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
          operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                          fragTemplate.m_template.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        tcu::StringTemplate::StringTemplate
                  ((StringTemplate *)&fragTemplate.m_template,&vertexShaderSource);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
        tcu::StringTemplate::specialize
                  (&local_3a8,(StringTemplate *)&fragTemplate.m_template,&params);
        if (DVar1 - TYPE_FLOAT < 4) {
          p_Var19 = (ShaderEvalFunc)(&PTR_evalArrayUniformFloat_00d25960)[DVar1 - TYPE_FLOAT];
        }
        else {
          p_Var19 = (ShaderEvalFunc)0x0;
        }
        pTVar5 = (TestNode *)operator_new(0xe0);
        ShaderIndexingCase::ShaderIndexingCase
                  ((ShaderIndexingCase *)pTVar5,pTVar2,&name,&desc,lVar16 == 0,p_Var19,
                   &vertexShaderSource,&local_3a8,DVar1,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
          operator_delete(vertexShaderSource._M_dataplus._M_p,
                          vertexShaderSource.field_2._M_allocated_capacity + 1);
        }
        tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragTemplate.m_template);
        tcu::StringTemplate::~StringTemplate(&vertTemplate);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&params);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
        std::ios_base::~ios_base(local_300);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
        std::ios_base::~ios_base(local_148);
        tcu::TestNode::addChild(local_410,pTVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)desc._M_dataplus._M_p != &desc.field_2) {
          operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        lVar16 = lVar16 + 4;
      } while (lVar16 == 4);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    lVar15 = local_388 + 1;
    if (lVar15 == 4) {
      tcu::TestNode::addChild((TestNode *)this,local_410);
      pTVar5 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 "tmp_array","Temporary array access tests.");
      lVar15 = 0;
      do {
        DVar1 = sr::(anonymous_namespace)::ShaderOperatorTests::init()::s_floatTypes[lVar15];
        local_388 = (ulong)(DVar1 - TYPE_FLOAT);
        lVar14 = 0;
        local_40 = lVar15;
        do {
          local_380 = "\tfor (int i = 0; i < ui_four; i++)\n";
          if (lVar14 == 2) {
            local_380 = "\tfor (int i = 0; i < 4; i++)\n";
          }
          local_38 = 0x23;
          if (lVar14 == 2) {
            local_38 = 0x1d;
          }
          lVar15 = 0;
          do {
            local_410 = (TestNode *)CONCAT71(local_410._1_7_,lVar15 == 1 || lVar14 == 1);
            pcVar11 = "\tfor (int i = 0; i < ui_four; i++)\n";
            if (lVar15 == 2) {
              pcVar11 = "\tfor (int i = 0; i < 4; i++)\n";
            }
            local_378 = 0x23;
            if (lVar15 == 2) {
              local_378 = 0x1d;
            }
            lVar16 = 0;
            do {
              glu::getShaderTypeName
                        (*(ShaderType *)
                          ((long)tessellation::createCommonEdgeTests(tcu::TestContext&)::
                                 primitiveTypes + lVar16));
              pcVar6 = glu::getDataTypeName(DVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar6,(allocator<char> *)&local_3a8);
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              fragTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate.m_template);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl._0_8_ = (long *)*plVar7;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              vertTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_360;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_360 = *plVar12;
                lStack_358 = plVar7[3];
              }
              else {
                local_360 = *plVar12;
                _frag = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_1a8;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_1a8 = *plVar12;
                lStack_1a0 = plVar7[3];
              }
              else {
                local_1a8 = *plVar12;
                _vtx = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                name.field_2._M_allocated_capacity = *psVar13;
                name.field_2._8_8_ = plVar7[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar13;
                name._M_dataplus._M_p = (pointer)*plVar7;
              }
              name._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if (_vtx != &local_1a8) {
                operator_delete(_vtx,local_1a8 + 1);
              }
              if (_frag != &local_360) {
                operator_delete(_frag,local_360 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Temporary array with ","");
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              fragTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate.m_template);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl._0_8_ = (long *)*plVar7;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              vertTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_360;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_360 = *plVar12;
                lStack_358 = plVar7[3];
              }
              else {
                local_360 = *plVar12;
                _frag = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_1a8 = *plVar12;
                lStack_1a0 = plVar7[3];
                _vtx = &local_1a8;
              }
              else {
                local_1a8 = *plVar12;
                _vtx = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                desc.field_2._M_allocated_capacity = *psVar13;
                desc.field_2._8_8_ = plVar7[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar13;
                desc._M_dataplus._M_p = (pointer)*plVar7;
              }
              desc._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if (_vtx != &local_1a8) {
                operator_delete(_vtx,local_1a8 + 1);
              }
              if (_frag != &local_360) {
                operator_delete(_frag,local_360 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar17 = (ostringstream *)&frag;
              if (lVar16 == 0) {
                poVar17 = (ostringstream *)&vtx;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"#version 310 es\n",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"#version 310 es\n",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n",0x2d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
              if (lVar16 == 0) {
                lVar18 = 0x2e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_color;\n",0x2f);
                pcVar6 = "layout(location = 0) in mediump vec4 v_color;\n";
              }
              else {
                lVar18 = 0x2f;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_coords;\n",0x30)
                ;
                pcVar6 = "layout(location = 0) in mediump vec4 v_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar18);
              if ((char)local_410 != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,
                           "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n"
                           ,0x49);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,
                           "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n"
                           ,0x48);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,
                           "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n"
                           ,0x48);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,
                           "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n"
                           ,0x4a);
              }
              if (lVar15 == 3 || lVar14 == 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,
                           "layout(std140, binding = 4) uniform something4 { mediump int ui_four; };\n"
                           ,0x49);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
              pcVar6 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
              if (lVar16 == 0) {
                pcVar6 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,pcVar6,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar17,"\t${PRECISION} ${VAR_TYPE} arr[${ARRAY_LEN}];\n",0x2d);
              if (lVar14 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tarr[0] = ${VAR_TYPE}(coords);\n",0x1f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tarr[1] = ${VAR_TYPE}(coords) * 0.5;\n",0x25);
                lVar18 = 0x27;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tarr[2] = ${VAR_TYPE}(coords) * 0.25;\n",0x26);
                pcVar6 = "\tarr[3] = ${VAR_TYPE}(coords) * 0.125;\n";
              }
              else if (lVar14 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tarr[ui_zero]  = ${VAR_TYPE}(coords);\n",0x26);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tarr[ui_one]   = ${VAR_TYPE}(coords) * 0.5;\n",0x2c)
                ;
                lVar18 = 0x2e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tarr[ui_two]   = ${VAR_TYPE}(coords) * 0.25;\n",0x2d
                          );
                pcVar6 = "\tarr[ui_three] = ${VAR_TYPE}(coords) * 0.125;\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,local_380,local_38);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,"\t{\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\t\tarr[i] = ${VAR_TYPE}(coords);\n",0x20);
                lVar18 = 3;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\t\tcoords = coords * 0.5;\n",0x19);
                pcVar6 = "\t}\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,pcVar6,lVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar17,"\t${PRECISION} ${VAR_TYPE} res = ${VAR_TYPE}(0.0);\n",
                         0x32);
              if (lVar15 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tres += arr[0];\n",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tres += arr[1];\n",0x10);
                lVar18 = 0x10;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tres += arr[2];\n",0x10);
                pcVar6 = "\tres += arr[3];\n";
              }
              else if (lVar15 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tres += arr[ui_zero];\n",0x16);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tres += arr[ui_one];\n",0x15);
                lVar18 = 0x17;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tres += arr[ui_two];\n",0x15);
                pcVar6 = "\tres += arr[ui_three];\n";
              }
              else {
                lVar18 = 0x11;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,pcVar11,local_378);
                pcVar6 = "\t\tres += arr[i];\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,pcVar6,lVar18);
              if (lVar16 == 0) {
                lVar18 = 0x14;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_color = vec4(res${PADDING});\n",0x20);
                pcVar6 = "\to_color = v_color;\n";
              }
              else {
                lVar18 = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
                pcVar6 = "\to_color = vec4(res${PADDING});\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar18);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])0xb1bc86,(char **)&fragTemplate.m_template);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_p != &local_4c0) {
                operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[2],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])"ARRAY_LEN",(char (*) [2])0xb20d95);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_p != &local_4c0) {
                operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0xb1bc97,(char (*) [8])0xb5805a);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_p != &local_4c0) {
                operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if (DVar1 == TYPE_FLOAT_VEC3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0xb25384);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (DVar1 == TYPE_FLOAT_VEC2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0xb2537f);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else if (DVar1 == TYPE_FLOAT) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[16],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [16])0xb253d0);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])0xac6ac7);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_p != &local_4c0) {
                operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              tcu::StringTemplate::StringTemplate
                        ((StringTemplate *)&fragTemplate.m_template,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize
                        (&local_3a8,(StringTemplate *)&fragTemplate.m_template,&params);
              if ((uint)local_388 < 4) {
                p_Var19 = (ShaderEvalFunc)(&PTR_evalArrayCoordsFloat_00d25980)[local_388];
              }
              else {
                p_Var19 = (ShaderEvalFunc)0x0;
              }
              pTVar8 = (TestNode *)operator_new(0xe0);
              ShaderIndexingCase::ShaderIndexingCase
                        ((ShaderIndexingCase *)pTVar8,pTVar2,&name,&desc,lVar16 == 0,p_Var19,
                         &vertexShaderSource,&local_3a8,DVar1,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragTemplate.m_template);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&params);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base(local_300);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base(local_148);
              tcu::TestNode::addChild(pTVar5,pTVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar16 = lVar16 + 4;
            } while (lVar16 == 4);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        lVar15 = local_40 + 1;
      } while (lVar15 != 4);
      tcu::TestNode::addChild((TestNode *)this,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 "vector_subscript","Vector subscript indexing.");
      lVar15 = 0;
      do {
        DVar1 = init::s_vectorTypes[lVar15];
        local_388 = (ulong)(DVar1 - TYPE_FLOAT_VEC2);
        lVar14 = 0;
        do {
          lVar16 = 0;
          do {
            local_410 = (TestNode *)CONCAT71(local_410._1_7_,lVar16 == 3 || lVar14 == 3);
            lVar18 = 0;
            do {
              glu::getShaderTypeName
                        (*(ShaderType *)
                          ((long)tessellation::createCommonEdgeTests(tcu::TestContext&)::
                                 primitiveTypes + lVar18));
              pcVar11 = glu::getDataTypeName(DVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar11,(allocator<char> *)&local_3a8);
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              fragTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl._0_8_ = (long *)*plVar7;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              vertTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_360;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_360 = *plVar12;
                lStack_358 = plVar7[3];
              }
              else {
                local_360 = *plVar12;
                _frag = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
              _vtx = &local_1a8;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_1a8 = *plVar12;
                lStack_1a0 = plVar7[3];
              }
              else {
                local_1a8 = *plVar12;
                _vtx = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                name.field_2._M_allocated_capacity = *psVar13;
                name.field_2._8_8_ = plVar7[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar13;
                name._M_dataplus._M_p = (pointer)*plVar7;
              }
              name._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if (_vtx != &local_1a8) {
                operator_delete(_vtx,local_1a8 + 1);
              }
              if (_frag != &local_360) {
                operator_delete(_frag,local_360 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Vector subscript access with ","");
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              fragTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl._0_8_ = (long *)*plVar7;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              vertTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_360;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_360 = *plVar12;
                lStack_358 = plVar7[3];
              }
              else {
                local_360 = *plVar12;
                _frag = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_1a8 = *plVar12;
                lStack_1a0 = plVar7[3];
                _vtx = &local_1a8;
              }
              else {
                local_1a8 = *plVar12;
                _vtx = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                desc.field_2._M_allocated_capacity = *psVar13;
                desc.field_2._8_8_ = plVar7[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar13;
                desc._M_dataplus._M_p = (pointer)*plVar7;
              }
              desc._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if (_vtx != &local_1a8) {
                operator_delete(_vtx,local_1a8 + 1);
              }
              if (_frag != &local_360) {
                operator_delete(_frag,local_360 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1d8,name._M_dataplus._M_p,&local_411);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1f8,desc._M_dataplus._M_p,&local_412);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar17 = (ostringstream *)&frag;
              if (lVar18 == 0) {
                poVar17 = (ostringstream *)&vtx;
              }
              iVar3 = glu::getDataTypeScalarSize(DVar1);
              pcVar11 = getIntUniformName(iVar3);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"#version 310 es\n",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"#version 310 es\n",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n",0x2d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
              if (lVar18 == 0) {
                lVar20 = 0x2e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location = 0) out mediump vec3 v_color;\n",0x2f);
                pcVar6 = "layout(location = 0) in mediump vec3 v_color;\n";
              }
              else {
                lVar20 = 0x2f;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_coords;\n",0x30)
                ;
                pcVar6 = "layout(location = 0) in mediump vec4 v_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar20);
              if ((char)local_410 != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,
                           "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n"
                           ,0x49);
                if (1 < iVar3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,
                             "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n"
                             ,0x48);
                }
                if (2 < iVar3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,
                             "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n"
                             ,0x48);
                }
                if (3 < iVar3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,
                             "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n"
                             ,0x4a);
                }
              }
              if (lVar16 == 5 || lVar14 == 5) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"layout(std140, binding = ",0x19);
                poVar9 = (ostream *)std::ostream::operator<<(poVar17,iVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,") uniform something",0x13);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," { mediump int ",0xf);
                sVar10 = strlen(pcVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar11,sVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; };\n",5);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
              pcVar6 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(v_coords);\n";
              if (lVar18 == 0) {
                pcVar6 = "\t${PRECISION} ${VAR_TYPE} coords = ${VAR_TYPE}(a_coords);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,pcVar6,0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar17,"\t${PRECISION} ${VAR_TYPE} tmp;\n",0x1f);
              iVar4 = (int)lVar14;
              if (iVar4 == 0) {
                lVar20 = 0x43;
                pcVar6 = "\ttmp = coords.${SWIZZLE} * vec4(1.0, 0.5, 0.25, 0.125).${SWIZZLE};\n";
LAB_00588b20:
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,pcVar6,lVar20)
                ;
              }
              else {
                if (iVar4 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\ttmp[0] = coords.x;\n",0x14);
                  if (1 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\ttmp[1] = coords.y * 0.5;\n",0x1a);
                  }
                  if (2 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\ttmp[2] = coords.z * 0.25;\n",0x1b);
                  }
                  lVar20 = 0x1c;
                  pcVar6 = "\ttmp[3] = coords.w * 0.125;\n";
                }
                else if (iVar4 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\ttmp.x = coords.x;\n",0x13);
                  if (1 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\ttmp.y = coords.y * 0.5;\n",0x19);
                  }
                  if (2 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\ttmp.z = coords.z * 0.25;\n",0x1a);
                  }
                  lVar20 = 0x1b;
                  pcVar6 = "\ttmp.w = coords.w * 0.125;\n";
                }
                else {
                  if (lVar14 != 3) {
                    if (lVar14 == 4) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar17,"\tfor (int i = 0; i < ",0x15);
                      poVar9 = (ostream *)std::ostream::operator<<(poVar17,iVar3);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar17,"\tfor (int i = 0; i < ",0x15);
                      sVar10 = strlen(pcVar11);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar17,pcVar11,sVar10);
                      poVar9 = (ostream *)poVar17;
                    }
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; i++)\n",7);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,"\t{\n",3)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\t\ttmp[i] = coords.x;\n",0x15);
                    lVar20 = 3;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\t\tcoords = coords.${ROT_SWIZZLE} * 0.5;\n",0x28
                              );
                    pcVar6 = "\t}\n";
                    goto LAB_00588b20;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\ttmp[ui_zero]  = coords.x;\n",0x1b);
                  if (1 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\ttmp[ui_one]   = coords.y * 0.5;\n",0x21);
                  }
                  if (2 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\ttmp[ui_two]   = coords.z * 0.25;\n",0x22);
                  }
                  lVar20 = 0x23;
                  pcVar6 = "\ttmp[ui_three] = coords.w * 0.125;\n";
                }
                if (3 < iVar3) goto LAB_00588b20;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar17,"\t${PRECISION} float res = 0.0;\n",0x1f);
              iVar4 = (int)lVar16;
              if (iVar4 == 0) {
                lVar20 = 0x23;
                pcVar11 = "\tres = dot(tmp, ${VAR_TYPE}(1.0));\n";
LAB_00588cfb:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,pcVar11,lVar20);
              }
              else {
                if (iVar4 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\tres += tmp[0];\n",0x10);
                  if (1 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\tres += tmp[1];\n",0x10);
                  }
                  if (2 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\tres += tmp[2];\n",0x10);
                  }
                  lVar20 = 0x10;
                  pcVar11 = "\tres += tmp[3];\n";
                }
                else if (iVar4 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\tres += tmp.x;\n",0xf);
                  if (1 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\tres += tmp.y;\n",0xf);
                  }
                  if (2 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\tres += tmp.z;\n",0xf);
                  }
                  lVar20 = 0xf;
                  pcVar11 = "\tres += tmp.w;\n";
                }
                else {
                  if (lVar16 != 3) {
                    if (lVar16 == 4) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar17,"\tfor (int i = 0; i < ",0x15);
                      poVar9 = (ostream *)std::ostream::operator<<(poVar17,iVar3);
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar17,"\tfor (int i = 0; i < ",0x15);
                      sVar10 = strlen(pcVar11);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)poVar17,pcVar11,sVar10);
                      poVar9 = (ostream *)poVar17;
                    }
                    lVar20 = 0x11;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; i++)\n",7);
                    pcVar11 = "\t\tres += tmp[i];\n";
                    goto LAB_00588cfb;
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\tres += tmp[ui_zero];\n",0x16);
                  if (1 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\tres += tmp[ui_one];\n",0x15);
                  }
                  if (2 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\tres += tmp[ui_two];\n",0x15);
                  }
                  lVar20 = 0x17;
                  pcVar11 = "\tres += tmp[ui_three];\n";
                }
                if (3 < iVar3) goto LAB_00588cfb;
              }
              if (lVar18 == 0) {
                lVar20 = 0x23;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_color = vec3(res);\n",0x16);
                pcVar11 = "\to_color = vec4(v_color.rgb, 1.0);\n";
              }
              else {
                lVar20 = 0x21;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
                pcVar11 = "\to_color = vec4(vec3(res), 1.0);\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar11,lVar20);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])0xb1bc86,(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_p != &local_4c0) {
                operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0xb1bc97,(char (*) [8])0xb5805a);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_p != &local_4c0) {
                operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[8],_const_char_*&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [8])0xb1b375,
                         (char **)(sr::(anonymous_namespace)::
                                   createVectorSubscriptCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,glu::DataType,vkt::sr::(anonymous_namespace)::VectorAccessType,vkt::sr::(anonymous_namespace)::VectorAccessType)
                                   ::s_swizzles + (long)iVar3 * 8));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_p != &local_4c0) {
                operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[12],_const_char_*&,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [12])"ROT_SWIZZLE",
                         (char **)(sr::(anonymous_namespace)::
                                   createVectorSubscriptCase(tcu::TestContext&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,glu::DataType,vkt::sr::(anonymous_namespace)::VectorAccessType,vkt::sr::(anonymous_namespace)::VectorAccessType)
                                   ::s_rotSwizzles + (long)iVar3 * 8));
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_p != &local_4c0) {
                operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_3a8,&fragTemplate,&params);
              if ((uint)local_388 < 3) {
                p_Var19 = (ShaderEvalFunc)(&PTR_evalSubscriptVec2_00d259a0)[local_388];
              }
              else {
                p_Var19 = (ShaderEvalFunc)0x0;
              }
              pTVar8 = (TestNode *)operator_new(0xe0);
              ShaderIndexingCase::ShaderIndexingCase
                        ((ShaderIndexingCase *)pTVar8,pTVar2,&local_1d8,&local_1f8,lVar18 == 0,
                         p_Var19,&vertexShaderSource,&local_3a8,DVar1,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base(local_300);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base(local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              tcu::TestNode::addChild(pTVar5,pTVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar18 = lVar18 + 4;
            } while (lVar18 == 4);
            lVar16 = lVar16 + 1;
          } while (lVar16 != 6);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 6);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      tcu::TestNode::addChild((TestNode *)this,pTVar5);
      pTVar5 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar5,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 "matrix_subscript","Matrix subscript indexing.");
      local_380 = (char *)0x0;
      do {
        DVar1 = init::s_matrixTypes[(long)local_380];
        local_378 = (ulong)(DVar1 - TYPE_FLOAT_MAT2);
        lVar15 = 0;
        do {
          lVar14 = 0;
          do {
            local_388 = CONCAT71(local_388._1_7_,lVar14 == 3 || lVar15 == 3);
            lVar16 = 0;
            local_410 = (TestNode *)lVar14;
            do {
              glu::getShaderTypeName
                        (*(ShaderType *)
                          ((long)tessellation::createCommonEdgeTests(tcu::TestContext&)::
                                 primitiveTypes + lVar16));
              pcVar11 = glu::getDataTypeName(DVar1);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vertexShaderSource,pcVar11,(allocator<char> *)&local_3a8);
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              fragTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl._0_8_ = (long *)*plVar7;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              vertTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_360;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_360 = *plVar12;
                lStack_358 = plVar7[3];
              }
              else {
                local_360 = *plVar12;
                _frag = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_1a8 = *plVar12;
                lStack_1a0 = plVar7[3];
                _vtx = &local_1a8;
              }
              else {
                local_1a8 = *plVar12;
                _vtx = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
              name._M_dataplus._M_p = (pointer)&name.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                name.field_2._M_allocated_capacity = *psVar13;
                name.field_2._8_8_ = plVar7[3];
              }
              else {
                name.field_2._M_allocated_capacity = *psVar13;
                name._M_dataplus._M_p = (pointer)*plVar7;
              }
              name._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if (_vtx != &local_1a8) {
                operator_delete(_vtx,local_1a8 + 1);
              }
              if (_frag != &local_360) {
                operator_delete(_frag,local_360 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              vertexShaderSource._M_dataplus._M_p = (pointer)&vertexShaderSource.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&vertexShaderSource,"Vector subscript access with ","");
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertexShaderSource);
              fragTemplate.m_template._M_dataplus._M_p = (pointer)&fragTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                fragTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                fragTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              fragTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&fragTemplate);
              params._M_t._M_impl._0_8_ =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
              }
              else {
                params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
                params._M_t._M_impl._0_8_ = (long *)*plVar7;
              }
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&params);
              vertTemplate.m_template._M_dataplus._M_p = (pointer)&vertTemplate.m_template.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template.field_2._8_8_ = plVar7[3];
              }
              else {
                vertTemplate.m_template.field_2._M_allocated_capacity = *psVar13;
                vertTemplate.m_template._M_dataplus._M_p = (pointer)*plVar7;
              }
              vertTemplate.m_template._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vertTemplate);
              _frag = &local_360;
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_360 = *plVar12;
                lStack_358 = plVar7[3];
              }
              else {
                local_360 = *plVar12;
                _frag = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&frag);
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_1a8 = *plVar12;
                lStack_1a0 = plVar7[3];
                _vtx = &local_1a8;
              }
              else {
                local_1a8 = *plVar12;
                _vtx = (long *)*plVar7;
              }
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&vtx);
              desc._M_dataplus._M_p = (pointer)&desc.field_2;
              psVar13 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar13) {
                desc.field_2._M_allocated_capacity = *psVar13;
                desc.field_2._8_8_ = plVar7[3];
              }
              else {
                desc.field_2._M_allocated_capacity = *psVar13;
                desc._M_dataplus._M_p = (pointer)*plVar7;
              }
              desc._M_string_length = plVar7[1];
              *plVar7 = (long)psVar13;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if (_vtx != &local_1a8) {
                operator_delete(_vtx,local_1a8 + 1);
              }
              if (_frag != &local_360) {
                operator_delete(_frag,local_360 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
                  &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)params._M_t._M_impl._0_8_,
                                (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                               _M_parent)->_M_color + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              pTVar2 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1d8,name._M_dataplus._M_p,&local_411);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1f8,desc._M_dataplus._M_p,&local_412);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
              poVar17 = (ostringstream *)&frag;
              if (lVar16 == 0) {
                poVar17 = (ostringstream *)&vtx;
              }
              iVar3 = glu::getDataTypeMatrixNumColumns(DVar1);
              iVar4 = glu::getDataTypeMatrixNumRows(DVar1);
              pcVar11 = getIntUniformName(iVar3);
              dataType = glu::getDataTypeFloatVec(iVar4);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"#version 310 es\n",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"#version 310 es\n",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"layout(location = 1) in highp vec4 a_coords;\n",0x2d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
              if (lVar16 == 0) {
                lVar18 = 0x2e;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_color;\n",0x2f);
                pcVar6 = "layout(location = 0) in mediump vec4 v_color;\n";
              }
              else {
                lVar18 = 0x2f;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"layout(location = 0) out mediump vec4 v_coords;\n",0x30)
                ;
                pcVar6 = "layout(location = 0) in mediump vec4 v_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar6,lVar18);
              if (lVar14 == 1 || lVar15 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,
                           "layout(std140, binding = 0) uniform something0 { mediump int ui_zero; };\n"
                           ,0x49);
                if (1 < iVar3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,
                             "layout(std140, binding = 1) uniform something1 { mediump int ui_one; };\n"
                             ,0x48);
                }
                if (2 < iVar3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,
                             "layout(std140, binding = 2) uniform something2 { mediump int ui_two; };\n"
                             ,0x48);
                }
                if (3 < iVar3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,
                             "layout(std140, binding = 3) uniform something3 { mediump int ui_three; };\n"
                             ,0x4a);
                }
              }
              if ((char)local_388 != '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"layout(std140, binding = ",0x19);
                poVar9 = (ostream *)std::ostream::operator<<(poVar17,iVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,") uniform something",0x13);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," { mediump int ",0xf);
                sVar10 = strlen(pcVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar11,sVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; };\n",5);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"{\n",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&vtx,"\tgl_Position = a_position;\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&frag,"void main()\n",0xc);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"{\n",2);
              pcVar6 = "\t${PRECISION} vec4 coords = v_coords;\n";
              if (lVar16 == 0) {
                pcVar6 = "\t${PRECISION} vec4 coords = a_coords;\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,pcVar6,0x26);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar17,"\t${PRECISION} ${MAT_TYPE} tmp;\n",0x1f);
              if (lVar15 == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\ttmp[0] = ${VEC_TYPE}(coords);\n",0x1f);
                if (1 < iVar3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\ttmp[1] = ${VEC_TYPE}(coords.yzwx) * 0.5;\n",0x2a)
                  ;
                }
                if (2 < iVar3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\ttmp[2] = ${VEC_TYPE}(coords.zwxy) * 0.25;\n",0x2b
                            );
                }
                lVar18 = 0x2c;
                pcVar6 = "\ttmp[3] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
LAB_00589d9b:
                if (3 < iVar3) goto LAB_00589e59;
              }
              else {
                if (lVar15 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\ttmp[ui_zero]  = ${VEC_TYPE}(coords);\n",0x26);
                  if (1 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,
                               "\ttmp[ui_one]   = ${VEC_TYPE}(coords.yzwx) * 0.5;\n",0x31);
                  }
                  if (2 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,
                               "\ttmp[ui_two]   = ${VEC_TYPE}(coords.zwxy) * 0.25;\n",0x32);
                  }
                  lVar18 = 0x33;
                  pcVar6 = "\ttmp[ui_three] = ${VEC_TYPE}(coords.wxyz) * 0.125;\n";
                  goto LAB_00589d9b;
                }
                if (lVar15 == 2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\tfor (int i = 0; i < ",0x15);
                  poVar9 = (ostream *)std::ostream::operator<<(poVar17,iVar3);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\tfor (int i = 0; i < ",0x15);
                  sVar10 = strlen(pcVar11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,pcVar11,sVar10);
                  poVar9 = (ostream *)poVar17;
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; i++)\n",7);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,"\t{\n",3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\t\ttmp[i] = ${VEC_TYPE}(coords);\n",0x20);
                lVar18 = 3;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\t\tcoords = coords.yzwx * 0.5;\n",0x1e);
                pcVar6 = "\t}\n";
LAB_00589e59:
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar17,pcVar6,lVar18)
                ;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar17,"\t${PRECISION} ${VEC_TYPE} res = ${VEC_TYPE}(0.0);\n",
                         0x32);
              if (local_410 == (TestNode *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,"\tres += tmp[0];\n",0x10);
                if (1 < iVar3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\tres += tmp[1];\n",0x10);
                }
                if (2 < iVar3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\tres += tmp[2];\n",0x10);
                }
                lVar18 = 0x10;
                pcVar11 = "\tres += tmp[3];\n";
LAB_00589f37:
                if (3 < iVar3) goto LAB_00589fb2;
              }
              else {
                if (local_410 == (TestNode *)0x1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\tres += tmp[ui_zero];\n",0x16);
                  if (1 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\tres += tmp[ui_one];\n",0x15);
                  }
                  if (2 < iVar3) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar17,"\tres += tmp[ui_two];\n",0x15);
                  }
                  lVar18 = 0x17;
                  pcVar11 = "\tres += tmp[ui_three];\n";
                  goto LAB_00589f37;
                }
                if (local_410 == (TestNode *)0x2) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\tfor (int i = 0; i < ",0x15);
                  poVar9 = (ostream *)std::ostream::operator<<(poVar17,iVar3);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,"\tfor (int i = 0; i < ",0x15);
                  sVar10 = strlen(pcVar11);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar17,pcVar11,sVar10);
                  poVar9 = (ostream *)poVar17;
                }
                lVar18 = 0x11;
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; i++)\n",7);
                pcVar11 = "\t\tres += tmp[i];\n";
LAB_00589fb2:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar17,pcVar11,lVar18);
              }
              if (lVar16 == 0) {
                lVar18 = 0x14;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_color = vec4(res${PADDING});\n",0x20);
                pcVar11 = "\to_color = v_color;\n";
              }
              else {
                lVar18 = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&vtx,"\tv_coords = a_coords;\n",0x16);
                pcVar11 = "\to_color = vec4(res${PADDING});\n";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,pcVar11,lVar18);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&vtx,"}\n",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&frag,"}\n",2);
              params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &params._M_t._M_impl.super__Rb_tree_header._M_header;
              params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(DVar1);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"MAT_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_p != &local_4c0) {
                operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              fragTemplate.m_template._M_dataplus._M_p = glu::getDataTypeName(dataType);
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[9],_const_char_*,_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [9])"VEC_TYPE",(char **)&fragTemplate);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_p != &local_4c0) {
                operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[10],_const_char_(&)[8],_true>
                        ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate,(char (*) [10])0xb1bc97,(char (*) [8])0xb5805a);
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)&params,
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&vertTemplate);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_p != &local_4c0) {
                operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              if (iVar4 == 3) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [6])0xb25384);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
                uVar21 = local_378;
              }
              else if (iVar4 == 2) {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[11],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [11])0xb2537f);
                uVar21 = local_378;
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              else {
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<const_char_(&)[8],_const_char_(&)[1],_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate,(char (*) [8])"PADDING",(char (*) [1])0xac6ac7);
                uVar21 = local_378;
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&params,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&vertTemplate);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_p != &local_4c0) {
                operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertTemplate.m_template._M_dataplus._M_p != &vertTemplate.m_template.field_2) {
                operator_delete(vertTemplate.m_template._M_dataplus._M_p,
                                vertTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              tcu::StringTemplate::StringTemplate(&vertTemplate,&fragTemplate.m_template);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fragTemplate.m_template._M_dataplus._M_p != &fragTemplate.m_template.field_2) {
                operator_delete(fragTemplate.m_template._M_dataplus._M_p,
                                fragTemplate.m_template.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              tcu::StringTemplate::StringTemplate(&fragTemplate,&vertexShaderSource);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::specialize(&vertexShaderSource,&vertTemplate,&params);
              tcu::StringTemplate::specialize(&local_3a8,&fragTemplate,&params);
              if ((uint)uVar21 < 9) {
                p_Var19 = (ShaderEvalFunc)(&PTR_evalSubscriptMat2_00d259b8)[uVar21];
              }
              else {
                p_Var19 = (ShaderEvalFunc)0x0;
              }
              pTVar8 = (TestNode *)operator_new(0xe0);
              ShaderIndexingCase::ShaderIndexingCase
                        ((ShaderIndexingCase *)pTVar8,pTVar2,&local_1d8,&local_1f8,lVar16 == 0,
                         p_Var19,&vertexShaderSource,&local_3a8,DVar1,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
                operator_delete(local_3a8._M_dataplus._M_p,
                                local_3a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)vertexShaderSource._M_dataplus._M_p != &vertexShaderSource.field_2) {
                operator_delete(vertexShaderSource._M_dataplus._M_p,
                                vertexShaderSource.field_2._M_allocated_capacity + 1);
              }
              tcu::StringTemplate::~StringTemplate(&fragTemplate);
              tcu::StringTemplate::~StringTemplate(&vertTemplate);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&params._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
              std::ios_base::~ios_base(local_300);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
              std::ios_base::~ios_base(local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              tcu::TestNode::addChild(pTVar5,pTVar8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)desc._M_dataplus._M_p != &desc.field_2) {
                operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)name._M_dataplus._M_p != &name.field_2) {
                operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
              }
              lVar16 = lVar16 + 4;
            } while (lVar16 == 4);
            lVar14 = (long)local_410 + 1;
          } while (lVar14 != 4);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        local_380 = (char *)((long)local_380 + 1);
        if (local_380 == (char *)0x9) {
          tcu::TestNode::addChild((TestNode *)this,pTVar5);
          return extraout_EAX;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void ShaderIndexingTests::init (void)
{
	static const ShaderType s_shaderTypes[] =
	{
		SHADERTYPE_VERTEX,
		SHADERTYPE_FRAGMENT
	};

	static const DataType s_floatAndVecTypes[] =
	{
		TYPE_FLOAT,
		TYPE_FLOAT_VEC2,
		TYPE_FLOAT_VEC3,
		TYPE_FLOAT_VEC4
	};

	// Varying array access cases.
	{
		de::MovePtr<TestCaseGroup> varyingGroup(new TestCaseGroup(m_testCtx, "varying_array", "Varying array access tests."));

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int vertAccess = 0; vertAccess < INDEXACCESS_LAST; vertAccess++)
			{
				for (int fragAccess = 0; fragAccess < INDEXACCESS_LAST; fragAccess++)
				{
					const char* vertAccessName = getIndexAccessTypeName((IndexAccessType)vertAccess);
					const char* fragAccessName = getIndexAccessTypeName((IndexAccessType)fragAccess);
					string name = string(getDataTypeName(varType)) + "_" + vertAccessName + "_write_" + fragAccessName + "_read";
					string desc = string("Varying array with ") + vertAccessName + " write in vertex shader and " + fragAccessName + " read in fragment shader.";
					de::MovePtr<ShaderIndexingCase> testCase(createVaryingArrayCase(m_testCtx, name, desc, varType, (IndexAccessType)vertAccess, (IndexAccessType)fragAccess));
					varyingGroup->addChild(testCase.release());
				}
			}
		}

		addChild(varyingGroup.release());
	}

	// Uniform array access cases.
	{
		de::MovePtr<TestCaseGroup> uniformGroup(new TestCaseGroup(m_testCtx, "uniform_array", "Uniform array access tests."));

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
			{
				const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);
				for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
				{
					ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
					const char*	shaderTypeName	= getShaderTypeName(shaderType);
					string		name			= string(getDataTypeName(varType)) + "_" + readAccessName + "_read_" + shaderTypeName;
					string		desc			= string("Uniform array with ") + readAccessName + " read in " + shaderTypeName + " shader.";
					bool isVertexCase = ((ShaderType)shaderType == SHADERTYPE_VERTEX);
					de::MovePtr<ShaderIndexingCase> testCase(createUniformArrayCase(m_testCtx, name, desc, isVertexCase, varType, (IndexAccessType)readAccess));
					uniformGroup->addChild(testCase.release());
				}
			}
		}

		addChild(uniformGroup.release());
	}

	// Temporary array access cases.
	{
		de::MovePtr<TestCaseGroup> tmpGroup(new TestCaseGroup(m_testCtx, "tmp_array", "Temporary array access tests."));

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_floatAndVecTypes); typeNdx++)
		{
			DataType varType = s_floatAndVecTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Temporary array with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						de::MovePtr<ShaderIndexingCase> testCase(createTmpArrayCase(m_testCtx, name, desc, isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
						tmpGroup->addChild(testCase.release());
					}
				}
			}
		}

		addChild(tmpGroup.release());
	}

	// Vector indexing with subscripts.
	{
		de::MovePtr<TestCaseGroup> vecGroup(new TestCaseGroup(m_testCtx, "vector_subscript", "Vector subscript indexing."));

		static const DataType s_vectorTypes[] =
		{
			TYPE_FLOAT_VEC2,
			TYPE_FLOAT_VEC3,
			TYPE_FLOAT_VEC4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_vectorTypes); typeNdx++)
		{
			DataType varType = s_vectorTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < VECTORACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < VECTORACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getVectorAccessTypeName((VectorAccessType)writeAccess);
					const char* readAccessName = getVectorAccessTypeName((VectorAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						de::MovePtr<ShaderIndexingCase> testCase(createVectorSubscriptCase(m_testCtx, name.c_str(), desc.c_str(), isVertexCase, varType, (VectorAccessType)writeAccess, (VectorAccessType)readAccess));
						vecGroup->addChild(testCase.release());
					}
				}
			}
		}

		addChild(vecGroup.release());
	}

	// Matrix indexing with subscripts.
	{
		de::MovePtr<TestCaseGroup> matGroup(new TestCaseGroup(m_testCtx, "matrix_subscript", "Matrix subscript indexing."));

		static const DataType s_matrixTypes[] =
		{
			TYPE_FLOAT_MAT2,
			TYPE_FLOAT_MAT2X3,
			TYPE_FLOAT_MAT2X4,
			TYPE_FLOAT_MAT3X2,
			TYPE_FLOAT_MAT3,
			TYPE_FLOAT_MAT3X4,
			TYPE_FLOAT_MAT4X2,
			TYPE_FLOAT_MAT4X3,
			TYPE_FLOAT_MAT4
		};

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(s_matrixTypes); typeNdx++)
		{
			DataType varType = s_matrixTypes[typeNdx];
			for (int writeAccess = 0; writeAccess < INDEXACCESS_LAST; writeAccess++)
			{
				for (int readAccess = 0; readAccess < INDEXACCESS_LAST; readAccess++)
				{
					const char* writeAccessName = getIndexAccessTypeName((IndexAccessType)writeAccess);
					const char* readAccessName = getIndexAccessTypeName((IndexAccessType)readAccess);

					for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(s_shaderTypes); shaderTypeNdx++)
					{
						ShaderType	shaderType		= s_shaderTypes[shaderTypeNdx];
						const char* shaderTypeName	= getShaderTypeName(shaderType);
						string		name			= string(getDataTypeName(varType)) + "_" + writeAccessName + "_write_" + readAccessName + "_read_" + shaderTypeName;
						string		desc			= string("Vector subscript access with ") + writeAccessName + " write and " + readAccessName + " read in " + shaderTypeName + " shader.";
						bool		isVertexCase	= ((ShaderType)shaderType == SHADERTYPE_VERTEX);
						de::MovePtr<ShaderIndexingCase> testCase(createMatrixSubscriptCase(m_testCtx, name.c_str(), desc.c_str(), isVertexCase, varType, (IndexAccessType)writeAccess, (IndexAccessType)readAccess));
						matGroup->addChild(testCase.release());
					}
				}
			}
		}

		addChild(matGroup.release());
	}
}